

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

void __thiscall presolve::HPresolve::markRowDeleted(HPresolve *this,HighsInt row)

{
  _Rb_tree_header *p_Var1;
  double *pdVar2;
  double dVar3;
  const_iterator __position;
  
  dVar3 = (this->model->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[row];
  pdVar2 = (this->model->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + row;
  if ((dVar3 == *pdVar2) && (!NAN(dVar3) && !NAN(*pdVar2))) {
    p_Var1 = &(this->equations)._M_t._M_impl.super__Rb_tree_header;
    __position._M_node =
         (this->eqiters).
         super__Vector_base<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[row]._M_node;
    if ((_Rb_tree_header *)__position._M_node != p_Var1) {
      std::
      _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
      ::erase_abi_cxx11_((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                          *)&this->equations,__position);
      (this->eqiters).
      super__Vector_base<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[row]._M_node = &p_Var1->_M_header;
    }
  }
  (this->changedRowFlag).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[row] = '\x01';
  (this->rowDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[row] = '\x01';
  this->numDeletedRows = this->numDeletedRows + 1;
  return;
}

Assistant:

void HPresolve::markRowDeleted(HighsInt row) {
  assert(!rowDeleted[row]);

  // remove equations from set of equations
  if (model->row_lower_[row] == model->row_upper_[row] &&
      eqiters[row] != equations.end()) {
    equations.erase(eqiters[row]);
    eqiters[row] = equations.end();
  }

  // prevents row from being added to change vector
  changedRowFlag[row] = true;
  rowDeleted[row] = true;
  ++numDeletedRows;
}